

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O1

void do_cmd_birth_init(command *cmd)

{
  short sVar1;
  int iVar2;
  player *p;
  char *__s;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  player_race *r;
  player_class *c;
  size_t sVar6;
  long lVar7;
  int *piVar8;
  char *pcVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  char roman_token_chr1 [8];
  undefined8 local_60;
  char local_58 [40];
  
  p = player;
  character_dungeon = false;
  sVar1 = player->ht_birth;
  if (sVar1 == 0) {
    r = player_id2race(0);
    c = player_id2class(0);
    player_generate(p,r,c,false);
    goto LAB_001a112f;
  }
  pcVar9 = player->full_name;
  __s = find_roman_suffix_start(pcVar9);
  if (__s != (char *)0x0) {
    builtin_strncpy(local_58,"MDCLXVI",8);
    if (*__s == '\0') {
LAB_001a1063:
      iVar10 = -1;
    }
    else {
      sVar3 = strlen(__s);
      if (sVar3 == 0) {
        iVar10 = 0;
      }
      else {
        uVar11 = 0;
        iVar10 = 0;
        do {
          pcVar4 = strchr(local_58,(int)__s[uVar11]);
          if (pcVar4 != (char *)0x0) {
            uVar12 = (ulong)((int)pcVar4 - (int)local_58);
            if ((0x54UL >> (uVar12 & 0x3f) & 1) == 0) {
              lVar7 = 0;
            }
            else if (__s[uVar11 + 1] == '\0') {
              lVar7 = 0;
            }
            else {
              local_60 = *(char **)(&DAT_002ce7e0 + uVar12 * 8);
              pcVar5 = strchr(local_60,(int)__s[uVar11 + 1]);
              if (pcVar5 == (char *)0x0) {
                lVar7 = 0;
              }
              else {
                lVar7 = (long)(((int)pcVar5 - (int)local_60) + 1);
                uVar11 = uVar11 + 1;
              }
            }
            iVar10 = iVar10 + *(int *)(&DAT_00272f90 + lVar7 * 4 + uVar12 * 0xc);
          }
          if (pcVar4 == (char *)0x0) goto LAB_001a1063;
          uVar11 = uVar11 + 1;
        } while (uVar11 < sVar3);
      }
    }
    local_58[0x10] = 'C';
    local_58[0x11] = '\0';
    local_58[0x12] = 'L';
    local_58[0x13] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = 'X';
    local_58[0x16] = 'L';
    local_58[0x17] = '\0';
    local_58[0x18] = 'X';
    local_58[0x19] = '\0';
    local_58[0x1a] = '\0';
    local_58[0x1b] = 'I';
    local_58[0x1c] = 'X';
    local_58[0x1d] = '\0';
    local_58[0x1e] = 'V';
    local_58[0] = 'M';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = 'C';
    local_58[4] = 'M';
    local_58[5] = '\0';
    local_58[6] = 'D';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = 'C';
    local_58[10] = 'D';
    local_58[0xb] = '\0';
    local_58[0xc] = 'C';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = 'X';
    local_58[0x1f] = 0;
    local_58[0x20] = '\0';
    local_58[0x21] = 'I';
    local_58[0x22] = 'V';
    local_58[0x23] = '\0';
    local_58[0x24] = 'I';
    local_58[0x25] = '\0';
    local_58[0x26] = '\0';
    *__s = '\0';
    if (-1 < iVar10) {
      pcVar9 = pcVar9 + (0x20 - (long)__s);
      iVar10 = iVar10 + 1;
      while (0 < iVar10) {
        pcVar4 = (char *)((long)&local_60 + 5);
        piVar8 = &DAT_00272f50;
        do {
          pcVar4 = pcVar4 + 3;
          iVar2 = *piVar8;
          piVar8 = piVar8 + 1;
        } while (iVar10 < iVar2);
        sVar3 = strlen(__s);
        sVar6 = strlen(pcVar4);
        if (pcVar9 < (undefined1 *)(sVar3 + sVar6 + 1)) break;
        my_strcat(__s,pcVar4,(size_t)pcVar9);
        iVar10 = iVar10 - iVar2;
      }
      if (iVar10 < 1) goto LAB_001a1123;
      *__s = '\0';
    }
    msg("Sorry, could not deal with suffix");
  }
LAB_001a1123:
  save_roller_data(&quickstart_prev);
LAB_001a112f:
  quickstart_allowed = sVar1 != 0;
  event_signal_flag(EVENT_ENTER_BIRTH,(_Bool)quickstart_allowed);
  return;
}

Assistant:

void do_cmd_birth_init(struct command *cmd)
{
	char *buf;

	/* The dungeon is not ready */
	character_dungeon = false;

	/*
	 * If there's a quickstart character, store it for later use.
	 * If not, default to whatever the first of the choices is.
	 */
	if (player->ht_birth) {
		/* Handle incrementing name suffix */
		buf = find_roman_suffix_start(player->full_name);
		if (buf) {
			/* Try to increment the roman suffix */
			int success = int_to_roman(
				roman_to_int(buf) + 1,
				buf,
				sizeof(player->full_name) - (buf - (char *)&player->full_name));

			if (!success) {
				msg("Sorry, could not deal with suffix");
			}
		}

		save_roller_data(&quickstart_prev);
		quickstart_allowed = true;
	} else {
		player_generate(player, player_id2race(0), player_id2class(0), false);
		quickstart_allowed = false;
	}

	/* We're ready to start the birth process */
	event_signal_flag(EVENT_ENTER_BIRTH, quickstart_allowed);
}